

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

bool flatbuffers::SaveFile(char *name,char *buf,size_t len,bool binary)

{
  _Ios_Openmode _Var1;
  char cVar2;
  undefined3 in_register_00000009;
  bool bVar3;
  ofstream ofs;
  byte abStack_1f0 [480];
  
  _Var1 = _S_out;
  if (CONCAT31(in_register_00000009,binary) != 0) {
    _Var1 = _S_bin;
  }
  std::ofstream::ofstream(&ofs,name,_Var1);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    bVar3 = false;
  }
  else {
    std::ostream::write((char *)&ofs,(long)buf);
    bVar3 = (abStack_1f0[*(long *)(_ofs + -0x18)] & 1) == 0;
  }
  std::ofstream::~ofstream(&ofs);
  return bVar3;
}

Assistant:

bool SaveFile(const char *name, const char *buf, size_t len, bool binary) {
  std::ofstream ofs(name, binary ? std::ofstream::binary : std::ofstream::out);
  if (!ofs.is_open()) return false;
  ofs.write(buf, len);
  return !ofs.bad();
}